

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.hpp
# Opt level: O1

bool __thiscall OpenMD::SelectionCompiler::numberOrKeywordExpected(SelectionCompiler *this)

{
  bool bVar1;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"number or keyword expected","");
  bVar1 = compileError(this,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return bVar1;
}

Assistant:

bool numberOrKeywordExpected() {
      return compileError("number or keyword expected");
    }